

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::getkth(ParmParse *this,char *name,int k,string *ptr,int ival)

{
  char *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  Table *table;
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  table = (Table *)in_RDI[2].field_2._M_allocated_capacity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,in_RSI,&local_69);
  prefixedName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (anonymous_namespace)::(anonymous_namespace)::sgetval<std::__cxx11::string>
            (table,in_RDI,in_stack_ffffffffffffff58,0,0xf0fbd2);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void
ParmParse::getkth (const char* name,
                   int         k,
                   std::string&    ptr,
                   int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival,k);
}